

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void assignment(Vm *vm)

{
  size_t length;
  char *name;
  uint32_t uVar1;
  uint8_t instruction;
  Variable VVar2;
  Token TStack_38;
  
  logic_or(vm);
  if ((vm->compiler).token.type != TOKEN_EQUALS) {
    return;
  }
  length = (vm->compiler).previous.length;
  name = (vm->compiler).previous.start;
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1b');
  consume(&TStack_38,vm,TOKEN_EQUALS,"Expected \'=\' after variable name");
  expr(vm);
  VVar2 = resolve_var(vm,name,length);
  if ((VVar2._8_8_ >> 0x20 & 1) != 0) {
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1a');
    uVar1 = vm->frame_count;
    instruction = '\x16';
    if (uVar1 != VVar2.frame_offset) {
      write_code_buffer(&(vm->frames).frame_pointers[uVar1 - 1]->code_buffer,'\x19');
      uVar1 = vm->frame_count;
      instruction = (uint8_t)VVar2.frame_offset;
    }
    write_code_buffer(&(vm->frames).frame_pointers[uVar1 - 1]->code_buffer,instruction);
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,
                      (uint8_t)VVar2.index);
    return;
  }
  printf("[Line %d] %s\n",
         (ulong)(vm->compiler).scope[(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].
                cap,"Cannot reassign val");
  longjmp((__jmp_buf_tag *)error_buf,2);
}

Assistant:

static void assignment(Vm *vm) {
    logic_or(vm);
    Token identifier = vm->compiler.previous;

    if (check(vm, TOKEN_EQUALS)) {
        // TODO remove unnecessary LOAD-POP combination
        emit_no_arg(vm, OP_POP);
        consume(vm, TOKEN_EQUALS, "Expected '=' after variable name");
        expr(vm);
        Variable var = resolve_var(vm, identifier.start, identifier.length);

        if (!var.assignable) {
            error(&vm->compiler, "Cannot reassign val");
        }

        emit_no_arg(vm, OP_DUP);

        if (var.frame_offset != vm->frame_count) {
            // TODO bigger numbers
            emit_short_arg(vm, OP_STORE_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
        } else {
            emit_byte_arg(vm, OP_STORE, (uint8_t) var.index);
        }
    }
}